

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpa.c
# Opt level: O2

void duckdb_je_hpa_shard_stats_merge(tsdn_t *tsdn,hpa_shard_t *shard,hpa_shard_stats_t *dst)

{
  malloc_mutex_lock(tsdn,&shard->grow_mtx);
  malloc_mutex_lock(tsdn,&shard->mtx);
  duckdb_je_psset_stats_accum(&dst->psset_stats,&(shard->psset).stats);
  hpa_shard_nonderived_stats_accum(&dst->nonderived_stats,&shard->stats);
  (shard->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(shard->mtx).field_0 + 0x48));
  (shard->grow_mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(shard->grow_mtx).field_0 + 0x48));
  return;
}

Assistant:

void
hpa_shard_stats_merge(tsdn_t *tsdn, hpa_shard_t *shard,
    hpa_shard_stats_t *dst) {
	hpa_do_consistency_checks(shard);

	malloc_mutex_lock(tsdn, &shard->grow_mtx);
	malloc_mutex_lock(tsdn, &shard->mtx);
	psset_stats_accum(&dst->psset_stats, &shard->psset.stats);
	hpa_shard_nonderived_stats_accum(&dst->nonderived_stats, &shard->stats);
	malloc_mutex_unlock(tsdn, &shard->mtx);
	malloc_mutex_unlock(tsdn, &shard->grow_mtx);
}